

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::genTessLevelCases
          (vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
           *__return_storage_ptr__,InvariantInnerTriangleSetCase *this)

{
  size_type sVar1;
  const_reference this_00;
  const_reference pvVar2;
  float fVar3;
  int local_b0;
  int local_ac;
  int i;
  int subNdx;
  LevelCase levelCase;
  TessLevels levels;
  TessLevels *base;
  int baseNdx;
  undefined1 local_4c [8];
  Random rnd;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  baseResults;
  int numSubCases;
  InvariantInnerTriangleSetCase *this_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  *result;
  
  PrimitiveSetInvarianceCase::genTessLevelCases
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
              *)&rnd.m_rnd.w,&this->super_PrimitiveSetInvarianceCase);
  rnd.m_rnd.z._3_1_ = 0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  ::vector(__return_storage_ptr__);
  de::Random::Random((Random *)local_4c,0x7b);
  base._0_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                    *)&rnd.m_rnd.w);
    if ((int)sVar1 <= (int)base) break;
    this_00 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
                            *)&rnd.m_rnd.w,(long)(int)base);
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
             ::operator[](&this_00->levels,0);
    levels.outer._0_8_ = *(undefined8 *)(pvVar2->outer + 2);
    levelCase.mem = (int)pvVar2->inner[0];
    levelCase._28_4_ = pvVar2->inner[1];
    levels.inner = *(float (*) [2])pvVar2->outer;
    PrimitiveSetInvarianceCase::LevelCase::LevelCase((LevelCase *)&i);
    for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                   *)&i,(value_type *)&levelCase.mem);
      for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
        fVar3 = de::Random::getFloat((Random *)local_4c,2.0,16.0);
        levels.inner[local_b0] = fVar3;
      }
      if ((this->super_PrimitiveSetInvarianceCase).m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        fVar3 = de::Random::getFloat((Random *)local_4c,2.0,16.0);
        levelCase._28_4_ = fVar3;
      }
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
    ::push_back(__return_storage_ptr__,(value_type *)&i);
    PrimitiveSetInvarianceCase::LevelCase::~LevelCase((LevelCase *)&i);
    base._0_4_ = (int)base + 1;
  }
  rnd.m_rnd.z._3_1_ = 1;
  de::Random::~Random((Random *)local_4c);
  if ((rnd.m_rnd.z._3_1_ & 1) == 0) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
    ::~vector(__return_storage_ptr__);
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
             *)&rnd.m_rnd.w);
  return __return_storage_ptr__;
}

Assistant:

virtual vector<LevelCase> genTessLevelCases (void) const
	{
		const int					numSubCases		= 4;
		const vector<LevelCase>		baseResults		= PrimitiveSetInvarianceCase::genTessLevelCases();
		vector<LevelCase>			result;
		de::Random					rnd				(123);

		// Generate variants with different values for irrelevant levels.
		for (int baseNdx = 0; baseNdx < (int)baseResults.size(); baseNdx++)
		{
			const TessLevels&	base	= baseResults[baseNdx].levels[0];
			TessLevels			levels	= base;
			LevelCase			levelCase;

			for (int subNdx = 0; subNdx < numSubCases; subNdx++)
			{
				levelCase.levels.push_back(levels);

				for (int i = 0; i < DE_LENGTH_OF_ARRAY(levels.outer); i++)
					levels.outer[i] = rnd.getFloat(2.0f, 16.0f);
				if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					levels.inner[1] = rnd.getFloat(2.0f, 16.0f);
			}

			result.push_back(levelCase);
		}

		return result;
	}